

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O0

string * glu::sl::injectExtensionRequirements
                   (string *__return_storage_ptr__,string *baseCode,
                   vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>
                   *extensions,ShaderType shaderType)

{
  bool bVar1;
  byte bVar2;
  bool bVar3;
  istream *piVar4;
  char *pcVar5;
  ostream *poVar6;
  bool local_54a;
  string local_528 [39];
  bool local_501;
  long lStack_500;
  bool isPreprocessorDirective;
  size_type firstNonWhitespace;
  string local_4f0 [32];
  ostringstream local_4d0 [8];
  ostringstream extStr;
  string local_350 [7];
  bool firstNonPreprocessorLine;
  string line;
  ostringstream local_320 [8];
  ostringstream resultBuf;
  istringstream local_1a8 [8];
  istringstream baseCodeBuf;
  ShaderType shaderType_local;
  vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_> *extensions_local;
  string *baseCode_local;
  
  std::__cxx11::istringstream::istringstream(local_1a8,(string *)baseCode,_S_in);
  std::__cxx11::ostringstream::ostringstream(local_320);
  std::__cxx11::string::string(local_350);
  bVar1 = true;
  std::__cxx11::ostringstream::ostringstream(local_4d0);
  generateExtensionStatements((ostringstream *)local_4d0,extensions,shaderType);
  std::__cxx11::ostringstream::str();
  bVar2 = std::__cxx11::string::empty();
  std::__cxx11::string::~string(local_4f0);
  if ((bVar2 & 1) == 0) {
    while( true ) {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_1a8,local_350);
      bVar3 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
      if (!bVar3) break;
      lStack_500 = std::__cxx11::string::find_first_not_of((char *)local_350,0x13b8ff8);
      local_54a = false;
      if (lStack_500 != -1) {
        pcVar5 = (char *)std::__cxx11::string::at((ulong)local_350);
        local_54a = *pcVar5 == '#';
      }
      local_501 = local_54a;
      if ((local_54a == false) && (bVar1)) {
        bVar1 = false;
        std::__cxx11::ostringstream::str();
        std::operator<<((ostream *)local_320,local_528);
        std::__cxx11::string::~string(local_528);
      }
      poVar6 = std::operator<<((ostream *)local_320,local_350);
      std::operator<<(poVar6,"\n");
    }
    std::__cxx11::ostringstream::str();
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)baseCode);
  }
  firstNonWhitespace._4_4_ = 1;
  std::__cxx11::ostringstream::~ostringstream(local_4d0);
  std::__cxx11::string::~string(local_350);
  std::__cxx11::ostringstream::~ostringstream(local_320);
  std::__cxx11::istringstream::~istringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string injectExtensionRequirements (const std::string& baseCode, const std::vector<RequiredExtension>& extensions, glu::ShaderType shaderType)
{
	std::istringstream	baseCodeBuf					(baseCode);
	std::ostringstream	resultBuf;
	std::string			line;
	bool				firstNonPreprocessorLine	= true;
	std::ostringstream	extStr;

	generateExtensionStatements(extStr, extensions, shaderType);

	// skip if no requirements
	if (extStr.str().empty())
		return baseCode;

	while (std::getline(baseCodeBuf, line))
	{
		// begins with '#'?
		const std::string::size_type	firstNonWhitespace		= line.find_first_not_of("\t ");
		const bool						isPreprocessorDirective	= (firstNonWhitespace != std::string::npos && line.at(firstNonWhitespace) == '#');

		// Inject #extensions
		if (!isPreprocessorDirective && firstNonPreprocessorLine)
		{
			firstNonPreprocessorLine = false;
			resultBuf << extStr.str();
		}

		resultBuf << line << "\n";
	}

	return resultBuf.str();
}